

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

ImGuiWindow ** __thiscall
ImVector<ImGuiWindow_*>::insert(ImVector<ImGuiWindow_*> *this,ImGuiWindow **it,ImGuiWindow **v)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiWindow **ppIVar4;
  ImGuiWindow **ppIVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  ppIVar5 = this->Data;
  if ((ppIVar5 <= it) && (iVar2 = this->Size, it <= ppIVar5 + iVar2)) {
    lVar8 = (long)it - (long)ppIVar5;
    iVar3 = this->Capacity;
    if (iVar2 == iVar3) {
      if (iVar3 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar3 / 2 + iVar3;
      }
      iVar9 = iVar2 + 1;
      if (iVar2 + 1 < iVar6) {
        iVar9 = iVar6;
      }
      if (iVar3 < iVar9) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        ppIVar5 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar9 << 3,GImAllocatorUserData);
        if (this->Data != (ImGuiWindow **)0x0) {
          memcpy(ppIVar5,this->Data,(long)this->Size << 3);
          ppIVar4 = this->Data;
          if ((ppIVar4 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
        }
        this->Data = ppIVar5;
        this->Capacity = iVar9;
      }
    }
    lVar7 = (long)this->Size - (lVar8 >> 3);
    if (lVar7 != 0 && lVar8 >> 3 <= (long)this->Size) {
      memmove((void *)((long)this->Data + lVar8 + 8),(void *)((long)this->Data + lVar8),lVar7 * 8);
    }
    *(ImGuiWindow **)((long)this->Data + lVar8) = *v;
    this->Size = this->Size + 1;
    return (ImGuiWindow **)(lVar8 + (long)this->Data);
  }
  __assert_fail("it >= Data && it <= Data + Size",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                ,0x720,
                "T *ImVector<ImGuiWindow *>::insert(const T *, const T &) [T = ImGuiWindow *]");
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }